

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database_tmpl_impl.hpp
# Opt level: O3

void hiberlite::Database::dbUpdate<Person>(bean_key *key,Person *bean)

{
  int *piVar1;
  BeanUpdater u;
  ChildKiller ck;
  shared_connection local_308;
  shared_connection local_2f8;
  shared_connection local_2e8;
  bean_key local_2d8;
  bean_key local_2c0;
  string local_2a8;
  string local_288;
  string local_268;
  BeanUpdater local_248;
  ChildKiller local_138;
  
  local_2e8._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  local_2e8.res = (key->con).res;
  if (local_2e8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_2e8.res)->refCount = (local_2e8.res)->refCount + 1;
  }
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"ROLLBACK TRANSACTION;","");
  dbExecQuery(&local_2e8,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  local_2e8._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (local_2e8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_2e8.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_2e8.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  local_2f8._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  local_2f8.res = (key->con).res;
  if (local_2f8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_2f8.res)->refCount = (local_2f8.res)->refCount + 1;
  }
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"BEGIN TRANSACTION;","");
  dbExecQuery(&local_2f8,&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  local_2f8._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (local_2f8.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_2f8.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_2f8.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  ChildKiller::ChildKiller(&local_138);
  local_2c0.id = key->id;
  local_2c0.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  local_2c0.con.res = (key->con).res;
  if (local_2c0.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_2c0.con.res)->refCount = (local_2c0.con.res)->refCount + 1;
  }
  ChildKiller::killChildren<Person>(&local_138,&local_2c0,bean);
  local_2c0.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (local_2c0.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_2c0.con.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_2c0.con.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  BeanUpdater::BeanUpdater(&local_248);
  local_2d8.id = key->id;
  local_2d8.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  local_2d8.con.res = (key->con).res;
  if (local_2d8.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_2d8.con.res)->refCount = (local_2d8.con.res)->refCount + 1;
  }
  BeanUpdater::update<Person>(&local_248,&local_2d8,bean);
  local_2d8.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (local_2d8.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_2d8.con.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_2d8.con.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  local_308._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  local_308.res = (key->con).res;
  if (local_308.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    (local_308.res)->refCount = (local_308.res)->refCount + 1;
  }
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"COMMIT TRANSACTION;","");
  dbExecQuery(&local_308,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  local_308._vptr_shared_res = (_func_int **)&PTR__shared_res_001997b8;
  if (local_308.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar1 = &(local_308.res)->refCount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_308.res)->_vptr_shared_cnt_obj_pair[1])();
    }
  }
  std::
  deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
  ::~deque((deque<hiberlite::shared_res<hiberlite::RowScope>,_std::allocator<hiberlite::shared_res<hiberlite::RowScope>_>_>
            *)&local_248.actor);
  AVisitor<hiberlite::UpdateBean>::~AVisitor(&local_248.super_AVisitor<hiberlite::UpdateBean>);
  std::_Deque_base<long_long,_std::allocator<long_long>_>::~_Deque_base
            ((_Deque_base<long_long,_std::allocator<long_long>_> *)&local_138.actor);
  AVisitor<hiberlite::KillChildren>::~AVisitor(&local_138.super_AVisitor<hiberlite::KillChildren>);
  return;
}

Assistant:

void Database::dbUpdate(bean_key key, C& bean)
{
	try{
		dbExecQuery(key.con,"ROLLBACK TRANSACTION;");
	}catch(...){}
	dbExecQuery(key.con,"BEGIN TRANSACTION;");

		ChildKiller ck;
		ck.killChildren(key,bean);
		BeanUpdater u;
		u.update(key, bean);

	dbExecQuery(key.con,"COMMIT TRANSACTION;");
}